

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallTargetGenerator::AddStripRule
          (cmInstallTargetGenerator *this,ostream *os,Indent *indent,string *toDestDirPath)

{
  cmMakefile *pcVar1;
  cmTarget *this_00;
  bool bVar2;
  char *__s;
  size_t sVar3;
  ostream *poVar4;
  int iVar5;
  string local_70;
  string local_50;
  
  if ((this->Target->TargetTypeValue != STATIC_LIBRARY) && (this->ImportLibrary == false)) {
    pcVar1 = this->Target->Makefile;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"APPLE","");
    bVar2 = cmMakefile::IsOn(pcVar1,&local_70);
    if (bVar2) {
      this_00 = this->Target;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MACOSX_BUNDLE","");
      bVar2 = cmTarget::GetPropertyAsBool(this_00,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (bVar2 == false) {
      pcVar1 = this->Target->Makefile;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_STRIP","");
      bVar2 = cmMakefile::IsSet(pcVar1,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (bVar2) {
        if (0 < indent->Level) {
          iVar5 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            iVar5 = iVar5 + 1;
          } while (iVar5 < indent->Level);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"if(CMAKE_INSTALL_DO_STRIP)\n",0x1b);
        if (0 < indent->Level) {
          iVar5 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            iVar5 = iVar5 + 1;
          } while (iVar5 < indent->Level);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"  execute_process(COMMAND \"",0x1b);
        pcVar1 = this->Target->Makefile;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_STRIP","");
        __s = cmMakefile::GetDefinition(pcVar1,&local_70);
        if (__s == (char *)0x0) {
          std::ios::clear((int)os + (int)os->_vptr_basic_ostream[-3]);
        }
        else {
          sVar3 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\" \"",3);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(toDestDirPath->_M_dataplus)._M_p,toDestDirPath->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\")\n",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (0 < indent->Level) {
          iVar5 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            iVar5 = iVar5 + 1;
          } while (iVar5 < indent->Level);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
      }
    }
  }
  return;
}

Assistant:

void
cmInstallTargetGenerator::AddStripRule(std::ostream& os,
                                       Indent const& indent,
                                       const std::string& toDestDirPath)
{

  // don't strip static and import libraries, because it removes the only
  // symbol table they have so you can't link to them anymore
  if(this->Target->GetType()==cmTarget::STATIC_LIBRARY || this->ImportLibrary)
    {
    return;
    }

  // Don't handle OSX Bundles.
  if(this->Target->GetMakefile()->IsOn("APPLE") &&
     this->Target->GetPropertyAsBool("MACOSX_BUNDLE"))
    {
    return;
    }

  if(! this->Target->GetMakefile()->IsSet("CMAKE_STRIP"))
    {
    return;
    }

  os << indent << "if(CMAKE_INSTALL_DO_STRIP)\n";
  os << indent << "  execute_process(COMMAND \""
     << this->Target->GetMakefile()->GetDefinition("CMAKE_STRIP")
     << "\" \"" << toDestDirPath << "\")\n";
  os << indent << "endif()\n";
}